

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.h
# Opt level: O2

void __thiscall
YAML::EmitterState::_Set<unsigned_long>
          (EmitterState *this,Setting<unsigned_long> *fmt,unsigned_long value,value scope)

{
  unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> local_30;
  __uniq_ptr_impl<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> local_28;
  Setting<unsigned_long> local_20;
  
  if (scope == Global) {
    Setting<unsigned_long>::set(&local_20,&fmt->m_value);
    if ((long *)local_20.m_value != (long *)0x0) {
      (**(code **)(*(long *)local_20.m_value + 8))();
    }
    local_20.m_value = 0;
    Setting<unsigned_long>::set((Setting<unsigned_long> *)&local_30,&fmt->m_value);
    std::
    vector<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>,std::allocator<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>>
    ::
    emplace_back<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>
              ((vector<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>,std::allocator<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>>
                *)&this->m_globalModifiedSettings,&local_30);
    local_28._M_t.
    super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
    .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl =
         (tuple<YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>)
         (tuple<YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>)
         local_30._M_t.
         super___uniq_ptr_impl<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
         .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl;
  }
  else {
    if (scope != Local) {
      return;
    }
    Setting<unsigned_long>::set((Setting<unsigned_long> *)&local_28,&fmt->m_value);
    std::
    vector<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>,std::allocator<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>>
    ::
    emplace_back<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>
              ((vector<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>,std::allocator<std::unique_ptr<YAML::SettingChangeBase,std::default_delete<YAML::SettingChangeBase>>>>
                *)&this->m_modifiedSettings,
               (unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_> *
               )&local_28);
  }
  if (local_28._M_t.
      super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
      .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>)
      0x0) {
    (*((SettingChangeBase *)
      local_28._M_t.
      super__Tuple_impl<0UL,_YAML::SettingChangeBase_*,_std::default_delete<YAML::SettingChangeBase>_>
      .super__Head_base<0UL,_YAML::SettingChangeBase_*,_false>._M_head_impl)->
      _vptr_SettingChangeBase[1])();
  }
  return;
}

Assistant:

void EmitterState::_Set(Setting<T>& fmt, T value, FmtScope::value scope) {
  switch (scope) {
    case FmtScope::Local:
      m_modifiedSettings.push(fmt.set(value));
      break;
    case FmtScope::Global:
      fmt.set(value);
      m_globalModifiedSettings.push(
          fmt.set(value));  // this pushes an identity set, so when we restore,
      // it restores to the value here, and not the previous one
      break;
    default:
      assert(false);
  }
}